

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O3

bool __thiscall fast_float::bigint::shl_bits(bigint *this,size_t n)

{
  ushort uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = (this->vec).length;
  uVar3 = (ulong)uVar1;
  if (uVar3 != 0) {
    bVar2 = 0x40 - (byte)n;
    uVar6 = 0;
    uVar4 = 0;
    do {
      uVar5 = (this->vec).data[uVar6];
      (this->vec).data[uVar6] = uVar4 >> (bVar2 & 0x3f) | uVar5 << ((byte)n & 0x3f);
      uVar6 = uVar6 + 1;
      uVar4 = uVar5;
    } while (uVar3 != uVar6);
    uVar5 = uVar5 >> (bVar2 & 0x3f);
    if (uVar5 != 0) {
      if (0x3d < uVar1) {
        return false;
      }
      (this->vec).data[uVar3] = uVar5;
      (this->vec).length = uVar1 + 1;
    }
  }
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool shl_bits(size_t n) noexcept {
    // Internally, for each item, we shift left by n, and add the previous
    // right shifted limb-bits.
    // For example, we transform (for u8) shifted left 2, to:
    //      b10100100 b01000010
    //      b10 b10010001 b00001000
    FASTFLOAT_DEBUG_ASSERT(n != 0);
    FASTFLOAT_DEBUG_ASSERT(n < sizeof(limb) * 8);

    size_t shl = n;
    size_t shr = limb_bits - shl;
    limb prev = 0;
    for (size_t index = 0; index < vec.len(); index++) {
      limb xi = vec[index];
      vec[index] = (xi << shl) | (prev >> shr);
      prev = xi;
    }

    limb carry = prev >> shr;
    if (carry != 0) {
      return vec.try_push(carry);
    }
    return true;
  }